

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_schema_features.c
# Opt level: O1

void get_features(ly_set *fset,char *module,char ***features)

{
  lyd_node **pplVar1;
  int iVar2;
  ulong uVar3;
  lyd_node *plVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = (ulong)fset->count;
  bVar6 = uVar5 != 0;
  if (bVar6) {
    pplVar1 = (fset->field_2).dnodes;
    plVar4 = *pplVar1;
    iVar2 = strcmp(module,*(char **)plVar4);
    if (iVar2 != 0) {
      uVar3 = 0;
      do {
        if (uVar5 - 1 == uVar3) goto LAB_00108ee2;
        plVar4 = pplVar1[uVar3 + 1];
        iVar2 = strcmp(module,*(char **)plVar4);
        uVar3 = uVar3 + 1;
      } while (iVar2 != 0);
      bVar6 = uVar3 < uVar5;
    }
    *features = (char **)plVar4->schema;
    *(undefined1 *)&plVar4->parent = 1;
    if (bVar6) {
      return;
    }
  }
LAB_00108ee2:
  *features = (char **)0x0;
  return;
}

Assistant:

void
get_features(const struct ly_set *fset, const char *module, const char ***features)
{
    /* get features list for this module */
    for (uint32_t u = 0; u < fset->count; ++u) {
        struct yl_schema_features *sf = (struct yl_schema_features *)fset->objs[u];

        if (!strcmp(module, sf->mod_name)) {
            /* matched module - explicitly set features */
            *features = (const char **)sf->features;
            sf->applied = 1;
            return;
        }
    }

    /* features not set so disable all */
    *features = NULL;
}